

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadLayerOffset(CrateReader *this,LayerOffset *d)

{
  ssize_t sVar1;
  LayerOffset *d_local;
  CrateReader *this_local;
  
  sVar1 = StreamReader::read(this->_sr,8,(void *)0x8,(size_t)d);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = StreamReader::read(this->_sr,8,(void *)0x8,(size_t)&d->_scale);
    if (sVar1 == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::ReadLayerOffset(LayerOffset *d) {
  static_assert(sizeof(LayerOffset) == 8 * 2, "LayerOffset must be 16bytes");

  // double x 2
  if (!_sr->read(sizeof(double), sizeof(double), reinterpret_cast<uint8_t *>(&(d->_offset)))) {
    return false;
  }
  if (!_sr->read(sizeof(double), sizeof(double), reinterpret_cast<uint8_t *>(&(d->_scale)))) {
    return false;
  }

  return true;
}